

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O0

void parse_object_should_parse_objects_with_multiple_elements(void)

{
  long lVar1;
  long in_FS_OFFSET;
  cJSON *local_88;
  cJSON *node;
  size_t i;
  char *expected_names [7];
  int expected_types [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  assert_parse_object("{\"one\":1\t,\t\"two\"\n:2, \"three\":3}");
  assert_is_child(item[0].child,"one",8);
  assert_is_child((item[0].child)->next,"two",8);
  assert_is_child((item[0].child)->next->next,"three",8);
  reset(item);
  expected_types[0] = 2;
  expected_types[1] = 1;
  expected_types[2] = 0x20;
  expected_types[3] = 0x10;
  expected_types[4] = 0x40;
  memcpy(&i,&PTR_anon_var_dwarf_3fe_0010ad50,0x38);
  assert_parse_object(
                     "{\"one\":1, \"NULL\":null, \"TRUE\":true, \"FALSE\":false, \"array\":[], \"world\":\"hello\", \"object\":{}}"
                     );
  local_88 = item[0].child;
  for (node = (cJSON *)0x0; node < (cJSON *)0x7 && local_88 != (cJSON *)0x0;
      node = (cJSON *)((long)&node->next + 1)) {
    assert_is_child(local_88,expected_names[(long)((long)&node[-1].string + 7)],
                    expected_types[(long)((long)&node[-1].string + 6)]);
    local_88 = local_88->next;
  }
  UnityAssertEqualNumber(node,7,0,0x95,0x14);
  reset(item);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_object_should_parse_objects_with_multiple_elements(void)
{
    assert_parse_object("{\"one\":1\t,\t\"two\"\n:2, \"three\":3}");
    assert_is_child(item->child, "one", cJSON_Number);
    assert_is_child(item->child->next, "two", cJSON_Number);
    assert_is_child(item->child->next->next, "three", cJSON_Number);
    reset(item);

    {
        size_t i = 0;
        cJSON *node = NULL;
        int expected_types[7] =
        {
            cJSON_Number,
            cJSON_NULL,
            cJSON_True,
            cJSON_False,
            cJSON_Array,
            cJSON_String,
            cJSON_Object
        };
        const char *expected_names[7] =
        {
            "one",
            "NULL",
            "TRUE",
            "FALSE",
            "array",
            "world",
            "object"
        };
        assert_parse_object("{\"one\":1, \"NULL\":null, \"TRUE\":true, \"FALSE\":false, \"array\":[], \"world\":\"hello\", \"object\":{}}");

        node = item->child;
        for (
                i = 0;
                (i < (sizeof(expected_types)/sizeof(int)))
                && (node != NULL);
                (void)i++, node = node->next)
        {
            assert_is_child(node, expected_names[i], expected_types[i]);
        }
        TEST_ASSERT_EQUAL_INT(i, 7);
        reset(item);
    }
}